

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O2

void RigidBodyDynamics::SolveLinearSystem(MatrixNd *A,VectorNd *b,VectorNd *x,LinearSolver ls)

{
  RBDLSizeMismatchError *this;
  ostream *poVar1;
  RBDLError *this_00;
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_1e8;
  string local_1d8;
  string local_1b8;
  ostringstream errormsg;
  
  if (((A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows ==
       (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) &&
     ((A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols ==
      (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)) {
    local_1e8.m_rhs = b;
    if (ls == LinearSolverHouseholderQR) {
      Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&errormsg,
                 (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)A);
      local_1e8.m_dec = (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&errormsg;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                (x,(Solve<Eigen::HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&local_1e8);
      Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~HouseholderQR
                ((HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&errormsg);
    }
    else if (ls == LinearSolverColPivHouseholderQR) {
      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&errormsg,
                 (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)A);
      local_1e8.m_dec = (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&errormsg;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                (x,&local_1e8);
      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~ColPivHouseholderQR
                ((ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&errormsg);
    }
    else {
      if (ls != LinearSolverPartialPivLU) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&errormsg);
        poVar1 = std::operator<<((ostream *)&errormsg,"Error: Invalid linear solver: ");
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,ls);
        std::endl<char,std::char_traits<char>>(poVar1);
        this_00 = (RBDLError *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        Errors::RBDLError::RBDLError(this_00,&local_1d8);
        __cxa_throw(this_00,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
      }
      Eigen::PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&errormsg,
                 (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)A);
      local_1e8.m_dec = (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&errormsg;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                (x,(Solve<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&local_1e8);
      Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~PartialPivLU
                ((PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&errormsg);
    }
    return;
  }
  this = (RBDLSizeMismatchError *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"Mismatching sizes.\n",(allocator<char> *)&errormsg);
  Errors::RBDLSizeMismatchError::RBDLSizeMismatchError(this,&local_1b8);
  __cxa_throw(this,&Errors::RBDLSizeMismatchError::typeinfo,Errors::RBDLError::~RBDLError);
}

Assistant:

void SolveLinearSystem (
  const MatrixNd& A,
  const VectorNd& b,
  VectorNd& x,
  LinearSolver ls
)
{
  if(A.rows() != b.size() || A.cols() != x.size()) {
    throw Errors::RBDLSizeMismatchError("Mismatching sizes.\n");
  }

#ifdef RBDL_USE_CASADI_MATH
  auto linsol = casadi::Linsol("linear_solver", "symbolicqr", A.sparsity());
  x = linsol.solve(A, b);
#else
  // Solve the system A*x = b.
  switch (ls) {
  case (LinearSolverPartialPivLU) :
    x = A.partialPivLu().solve(b);
    break;
  case (LinearSolverColPivHouseholderQR) :
    x = A.colPivHouseholderQr().solve(b);
    break;
  case (LinearSolverHouseholderQR) :
    x = A.householderQr().solve(b);
    break;
  default:
    std::ostringstream errormsg;
    errormsg << "Error: Invalid linear solver: " << ls << std::endl;
    throw Errors::RBDLError(errormsg.str());
    break;
  }
#endif
}